

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmSccRg<(moira::Instr)103,(moira::Mode)0,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Dn local_28;
  u16 local_22;
  Dn src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22 = op;
  _src = addr;
  Dn::Dn(&local_28,op & 7);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,local_28);
  return;
}

Assistant:

void
Moira::dasmSccRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn ( _____________xxx(op) );

    str << Ins<I>{} << str.tab << src;
}